

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O2

bool date::rfc3339::read<std::istreambuf_iterator<char,std::char_traits<char>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,parts *value)

{
  bool bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar2;
  short sVar3;
  character_t<char> local_141;
  offset_type offset_minutes;
  offset_type offset_hours;
  character_t<char> local_13c;
  character_t<char> local_13b;
  character_t<char> local_13a;
  character_t<char> local_139;
  parts local_138;
  parts *local_120;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_118;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_110;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_108;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_100;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_f8;
  unsigned_integer_t<unsigned_short,_4U,_4U> local_f0;
  optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> local_e8;
  cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
  local_d8;
  tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
  fmt;
  
  piVar2 = skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>(pos,end);
  pos->_M_sbuf = piVar2->_M_sbuf;
  pos->_M_c = piVar2->_M_c;
  bVar1 = std::istreambuf_iterator<char,_std::char_traits<char>_>::equal(pos,end);
  if (!bVar1) {
    local_f8.value = &local_138.month;
    local_100.value = &local_138.day;
    local_118.value = &local_138.hour;
    local_108.value = &local_138.minute;
    local_110.value = &local_138.second;
    local_e8.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>.
    super__Tuple_impl<1UL,_date::fraction_t<unsigned_int,_9U>_>.
    super__Head_base<1UL,_date::fraction_t<unsigned_int,_9U>,_false>._M_head_impl.value =
         (_Head_base<1UL,_date::fraction_t<unsigned_int,_9U>,_false>)&local_138.nanosecond;
    local_138.year = 0;
    local_138.month = '\0';
    local_138.day = '\0';
    local_138.hour = '\0';
    local_138.minute = '\0';
    local_138.second = '\0';
    local_138._7_1_ = 0;
    local_138.nanosecond = 0;
    local_138.offset_in_minutes = 0;
    local_138._14_2_ = 0;
    local_d8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Tuple_impl<2UL,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Head_base<2UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>._M_head_impl.value =
         (_Head_base<2UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>)&offset_minutes;
    offset_minutes = 0;
    local_f0.value = &local_138.year;
    local_139.value = '-';
    local_13a.value = '-';
    local_141.value = ':';
    local_13c.value = ':';
    local_d8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Head_base<1UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)':';
    local_d8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Head_base<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_false>._M_head_impl.value =
         (signed_integer_t<short,_2U,_2U,_true>)&offset_hours;
    offset_hours = 0;
    local_13b.value = 'T';
    local_e8.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>.
    super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)'.';
    local_d8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .super__Head_base<0UL,_date::branch_t<date::character_t<char>_>,_false>._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>_>.
    super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl.value =
         (branch_t<date::character_t<char>_>)(tuple<date::character_t<char>_>)0x5a;
    local_120 = value;
    std::
    tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    ::
    tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_true,_true>
              (&fmt,&local_f0,&local_139,&local_f8,&local_13a,&local_100,&local_13b,&local_118,
               &local_141,&local_108,&local_13c,&local_110,&local_e8,&local_d8);
    bVar1 = read<std::istreambuf_iterator<char,std::char_traits<char>>,date::unsigned_integer_t<unsigned_short,4u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>>
                      (pos,end,&fmt);
    if ((bVar1) && (bVar1 = validate(&local_138), bVar1)) {
      local_120->nanosecond = local_138.nanosecond;
      local_120->year = local_138.year;
      local_120->month = local_138.month;
      local_120->day = local_138.day;
      local_120->hour = local_138.hour;
      local_120->minute = local_138.minute;
      local_120->second = local_138.second;
      local_120->field_0x7 = local_138._7_1_;
      sVar3 = -offset_minutes;
      if (0 < offset_hours) {
        sVar3 = offset_minutes;
      }
      local_120->offset_in_minutes = sVar3 + offset_hours * 0x3c;
      return true;
    }
  }
  return false;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, parts& value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;

        pos = skip_spaces(pos, end);
        if (pos == end)
            return false;

        parts dt{};
        std::memset(static_cast<void*>(&dt), 0, sizeof(parts));

        offset_type offset_hours = 0;
        offset_type offset_minutes = 0;
        auto fmt = format(
            unsigned_integer<4, 4>(dt.year),   character<char_type>('-'),
            unsigned_integer<2, 2>(dt.month),  character<char_type>('-'),
            unsigned_integer<2, 2>(dt.day),    character<char_type>('T'),
            unsigned_integer<2, 2>(dt.hour),   character<char_type>(':'),
            unsigned_integer<2, 2>(dt.minute), character<char_type>(':'),
            unsigned_integer<2, 2>(dt.second),
            optional(
                character<char_type>('.'),
                fraction<9>(dt.nanosecond)),
            cases(
                branch(
                    character<char_type>('Z')),
                branch(
                    signed_integer<2, 2, SignRequired>(offset_hours),
                    character<char_type>(':'),
                    unsigned_integer<2, 2>(offset_minutes))));

        if (!::date::read(pos, end, fmt) || !validate(dt))
            return false;

        value = dt;
        value.offset_in_minutes = offset_hours * 60 + (offset_hours > 0 ? offset_minutes : -offset_minutes);
        return true;
    }